

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlNodeGetNsDefs(PyObject *self,PyObject *args)

{
  long lVar1;
  int iVar2;
  PyObject *pPVar3;
  PyObject *pyobj_node;
  undefined *local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"O:xmlNodeGetNsDefs",&local_10);
  if (iVar2 != 0) {
    if (((local_10 == &_Py_NoneStruct) || (lVar1 = *(long *)(local_10 + 0x10), lVar1 == 0)) ||
       (*(int *)(lVar1 + 8) != 1)) {
      pPVar3 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    else {
      pPVar3 = libxml_xmlNsPtrWrap(*(xmlNsPtr *)(lVar1 + 0x60));
    }
  }
  return pPVar3;
}

Assistant:

PyObject *
libxml_xmlNodeGetNsDefs(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    xmlNsPtr c_retval;
    xmlNodePtr node;
    PyObject *pyobj_node;

    if (!PyArg_ParseTuple
        (args, (char *) "O:xmlNodeGetNsDefs", &pyobj_node))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    c_retval = node->nsDef;
    py_retval = libxml_xmlNsPtrWrap((xmlNsPtr) c_retval);
    return (py_retval);
}